

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O3

void light_pcapng_release(light_pcapng pcapng)

{
  void *__ptr;
  uint uVar1;
  _light_pcapng *p_Var2;
  void *__ptr_00;
  uint uVar3;
  ulong uVar4;
  
  if (pcapng == (light_pcapng)0x0) {
    __ptr_00 = calloc(0,8);
  }
  else {
    uVar3 = 0;
    p_Var2 = pcapng;
    do {
      uVar3 = uVar3 + 1;
      p_Var2 = p_Var2->next_block;
    } while (p_Var2 != (_light_pcapng *)0x0);
    __ptr_00 = calloc((ulong)uVar3,8);
    if (pcapng != (light_pcapng)0x0) {
      uVar1 = 0;
      do {
        *(light_pcapng *)((long)__ptr_00 + (ulong)uVar1 * 8) = pcapng;
        uVar1 = uVar1 + 1;
        pcapng = pcapng->next_block;
      } while (pcapng != (_light_pcapng *)0x0);
    }
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        __ptr = *(void **)((long)__ptr_00 + uVar4 * 8);
        __free_option(*(_light_option **)((long)__ptr + 0x10));
        free(*(void **)((long)__ptr + 8));
        free(__ptr);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  free(__ptr_00);
  return;
}

Assistant:

void light_pcapng_release(light_pcapng pcapng)
{
	light_pcapng iter = pcapng;
	uint32_t block_count = light_get_block_count(pcapng);
	light_pcapng *block_pointers = calloc(block_count, sizeof(light_pcapng));
	uint32_t i = 0;

	while (iter != NULL) {
		block_pointers[i] = iter;
		i++;
		iter = iter->next_block;
	}

	for (i = 0; i < block_count; ++i) {
		__free_option(block_pointers[i]->options);
		free(block_pointers[i]->block_body);
		free(block_pointers[i]);
	}

	free(block_pointers);
}